

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::decide_to_pick_resonance(particleSamples *this,int monval)

{
  bool bVar1;
  
  if (this->particle_monval == 0xc32) {
    bVar1 = monval == 0xc8c;
  }
  else {
    bVar1 = monval == -0xc8c && this->particle_monval == -0xc32;
  }
  return (int)bVar1;
}

Assistant:

int particleSamples::decide_to_pick_resonance(int monval) {
    int pick_flag = 0;
    if (particle_monval == 3122) {
        // Lambda particles, we will consider feed down from Sigma^0
        if (monval == 3212) pick_flag = 1;
    } else if (particle_monval == -3122) {
        // Anti-Lambda particles, we will consider feed down from Anti-Sigma^0
        if (monval == -3212) pick_flag = 1;
    }
    return (pick_flag);
}